

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.h
# Opt level: O3

Float __thiscall
pbrt::PaddedSobolSampler::generateSample
          (PaddedSobolSampler *this,span<const_unsigned_int> C,uint32_t a,uint32_t hash)

{
  RandomizeStrategy RVar1;
  uint uVar2;
  uint uVar3;
  ulong uVar4;
  uint *puVar5;
  undefined1 auVar6 [16];
  undefined1 in_XMM2 [16];
  
  uVar4 = (ulong)a;
  puVar5 = C.ptr;
  RVar1 = this->randomizeStrategy;
  if (RVar1 == Owen) {
    if (a != 0) {
      do {
        uVar2 = (uint)uVar4;
        uVar4 = uVar4 >> 1;
      } while (1 < uVar2);
    }
    halt_baddata();
  }
  if (RVar1 == Xor) {
    uVar2 = 0;
    if (a != 0) {
      do {
        if ((uVar4 & 1) != 0) {
          uVar2 = uVar2 ^ *puVar5;
        }
        uVar3 = (uint)uVar4;
        uVar4 = uVar4 >> 1;
        puVar5 = puVar5 + 1;
      } while (1 < uVar3);
    }
    uVar2 = uVar2 ^ hash;
  }
  else {
    if (RVar1 != None) {
      LogFatal(Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/samplers.h"
               ,0xb0,"Unhandled randomization strategy");
    }
    if (a == 0) {
      auVar6 = ZEXT816(0) << 0x40;
      goto LAB_0035be98;
    }
    uVar2 = 0;
    do {
      if ((uVar4 & 1) != 0) {
        uVar2 = uVar2 ^ *puVar5;
      }
      uVar3 = (uint)uVar4;
      uVar4 = uVar4 >> 1;
      puVar5 = puVar5 + 1;
    } while (1 < uVar3);
  }
  auVar6 = vcvtusi2ss_avx512f(in_XMM2,uVar2);
  auVar6 = ZEXT416((uint)(auVar6._0_4_ * 2.3283064e-10));
LAB_0035be98:
  auVar6 = vminss_avx(SUB6416(ZEXT464(0x3f7fffff),0),auVar6);
  return auVar6._0_4_;
}

Assistant:

PBRT_CPU_GPU
    Float generateSample(pstd::span<const uint32_t> C, uint32_t a, uint32_t hash) const {
        switch (randomizeStrategy) {
        case RandomizeStrategy::None:
            return SampleGeneratorMatrix(C, a, NoRandomizer());
        case RandomizeStrategy::Xor:
            return SampleGeneratorMatrix(C, a, XORScrambler(hash));
        case RandomizeStrategy::Owen:
            return SampleGeneratorMatrix(C, a, OwenScrambler(hash));
        default:
            LOG_FATAL("Unhandled randomization strategy");
            return {};
        }
    }